

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::add_ses_extension
          (session_impl *this,shared_ptr<libtorrent::plugin> *ext)

{
  element_type *peVar1;
  uint uVar2;
  __shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2> _Stack_68;
  undefined8 local_58;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined8 local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar2 = (*((ext->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_plugin[2])();
  ::std::
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ::push_back((this->m_ses_extensions)._M_elems,ext);
  if ((uVar2 & 2) != 0) {
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back((this->m_ses_extensions)._M_elems + 1,ext);
  }
  if ((uVar2 & 4) != 0) {
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back((this->m_ses_extensions)._M_elems + 2,ext);
  }
  if ((uVar2 & 8) != 0) {
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back((this->m_ses_extensions)._M_elems + 3,ext);
  }
  if ((uVar2 & 0x20) != 0) {
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back((this->m_ses_extensions)._M_elems + 4,ext);
  }
  if ((uVar2 & 0x10) != 0) {
    ::std::__shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_68,&ext->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>);
    alert_manager::add_extension(&this->m_alerts,(shared_ptr<libtorrent::plugin> *)&_Stack_68);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_68._M_refcount);
  }
  ::std::__shared_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::session_impl,void>
            ((__shared_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::session_impl>);
  ::std::__weak_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<libtorrent::aux::session_impl,void>
            ((__weak_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             &local_38);
  local_48 = local_58;
  _Stack_40._M_pi = _Stack_50._M_pi;
  local_58 = 0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_50);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  peVar1 = (ext->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_plugin[4])(peVar1,&local_48);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_40);
  return;
}

Assistant:

void session_impl::add_ses_extension(std::shared_ptr<plugin> ext)
	{
		// this is called during startup of the session, from the thread creating
		// it, not its own thread
//		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT_VAL(ext, ext);

		feature_flags_t const features = ext->implemented_features();

		m_ses_extensions[plugins_all_idx].push_back(ext);

		if (features & plugin::optimistic_unchoke_feature)
			m_ses_extensions[plugins_optimistic_unchoke_idx].push_back(ext);
		if (features & plugin::tick_feature)
			m_ses_extensions[plugins_tick_idx].push_back(ext);
		if (features & plugin::dht_request_feature)
			m_ses_extensions[plugins_dht_request_idx].push_back(ext);
		if (features & plugin::unknown_torrent_feature)
			m_ses_extensions[plugins_unknown_torrent_idx].push_back(ext);
		if (features & plugin::alert_feature)
			m_alerts.add_extension(ext);
		session_handle h(shared_from_this());
		ext->added(h);
	}